

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlFeatures.h
# Opt level: O1

void __thiscall GdlFeatureSetting::AddExtName(GdlFeatureSetting *this,utf16 wLangID,wstring *stu)

{
  pointer pwVar1;
  wstring local_90;
  GdlExtName local_70;
  
  pwVar1 = (stu->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&local_90,pwVar1,pwVar1 + stu->_M_string_length);
  GdlExtName::GdlExtName(&local_70,&local_90,wLangID);
  std::vector<GdlExtName,_std::allocator<GdlExtName>_>::emplace_back<GdlExtName>
            (&this->m_vextname,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_70.m_stuName._M_dataplus._M_p != &local_70.m_stuName.field_2) {
    operator_delete(local_70.m_stuName._M_dataplus._M_p,
                    local_70.m_stuName.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.super_GdlObject.m_lnf.m_staFile._M_dataplus._M_p !=
      &local_70.super_GdlObject.m_lnf.m_staFile.field_2) {
    operator_delete(local_70.super_GdlObject.m_lnf.m_staFile._M_dataplus._M_p,
                    local_70.super_GdlObject.m_lnf.m_staFile.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity * 4 + 4);
  }
  return;
}

Assistant:

void AddExtName(utf16 wLangID, std::wstring stu)
	{
		m_vextname.push_back(GdlExtName(stu, wLangID));
	}